

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncModuleField::~FuncModuleField(FuncModuleField *this)

{
  FuncModuleField *this_local;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__FuncModuleField_01e53618;
  Func::~Func(&this->func);
  ModuleFieldMixin<(wabt::ModuleFieldType)0>::~ModuleFieldMixin
            (&this->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>);
  return;
}

Assistant:

explicit FuncModuleField(const Location& loc = Location(),
                           string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Func>(loc), func(name) {}